

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::AddLayerParams::~AddLayerParams(AddLayerParams *this)

{
  AddLayerParams *this_local;
  
  ~AddLayerParams(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

AddLayerParams::~AddLayerParams() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.AddLayerParams)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}